

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

ValueType * __thiscall
HighsHashTable<int,_double>::operator[](HighsHashTable<int,_double> *this,KeyType_conflict *key)

{
  HighsHashTableEntry<int,_double> *pHVar1;
  byte bVar2;
  uchar uVar3;
  _Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false> _Var4;
  uchar *puVar5;
  undefined8 uVar6;
  double dVar7;
  undefined8 uVar8;
  bool bVar9;
  double *pdVar10;
  ulong uVar11;
  u8 meta;
  u64 pos;
  u64 maxPos;
  Entry entry;
  u64 startPos;
  uchar local_59;
  ulong local_58;
  ulong local_50;
  HighsHashTableEntry<int,_double> local_48;
  ulong local_30;
  HighsHashTableEntry<int,_double> local_28;
  
  _Var4._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>._M_head_impl;
  bVar9 = findPosition(this,key,&local_59,&local_30,&local_50,&local_58);
  if (bVar9) {
    pdVar10 = (double *)((long)(_Var4._M_head_impl + local_58) + 8);
  }
  else {
    if ((this->numElements == this->tableSizeMask * 7 + 7 >> 3) || (local_58 == local_50)) {
      growTable(this);
    }
    else {
      uVar8 = _Var4._M_head_impl + local_58;
      local_48.key_ = *key;
      local_48.value_ = 0.0;
      this->numElements = this->numElements + 1;
      do {
        puVar5 = (this->metadata)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        bVar2 = puVar5[local_58];
        if (-1 < (char)bVar2) {
          puVar5[local_58] = local_59;
          pHVar1 = _Var4._M_head_impl + local_58;
          pHVar1->key_ = local_48.key_;
          *(undefined4 *)&pHVar1->field_0x4 = local_48._4_4_;
          pHVar1->value_ = local_48.value_;
          return (double *)(uVar8 + 8);
        }
        uVar11 = (ulong)((int)local_58 - (uint)bVar2 & 0x7f);
        if (uVar11 < (local_58 - local_30 & this->tableSizeMask)) {
          local_28.key_ = local_48.key_;
          local_28._4_4_ = local_48._4_4_;
          local_28.value_ = local_48.value_;
          pHVar1 = _Var4._M_head_impl + local_58;
          uVar6._0_4_ = pHVar1->key_;
          uVar6._4_4_ = *(undefined4 *)&pHVar1->field_0x4;
          dVar7 = pHVar1->value_;
          pHVar1 = _Var4._M_head_impl + local_58;
          pHVar1->key_ = local_48.key_;
          *(undefined4 *)&pHVar1->field_0x4 = local_48._4_4_;
          pHVar1->value_ = local_48.value_;
          puVar5 = (this->metadata)._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          uVar3 = puVar5[local_58];
          puVar5[local_58] = local_59;
          local_30 = local_58 - uVar11 & this->tableSizeMask;
          local_50 = local_30 + 0x7f & this->tableSizeMask;
          local_59 = uVar3;
          local_48._0_8_ = uVar6;
          local_48.value_ = dVar7;
        }
        local_58 = local_58 + 1 & this->tableSizeMask;
      } while (local_58 != local_50);
      growTable(this);
      HighsHashTable<int,double>::insert<HighsHashTableEntry<int,double>>
                ((HighsHashTable<int,double> *)this,&local_48);
    }
    pdVar10 = operator[](this,key);
  }
  return pdVar10;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }